

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_tar.c
# Opt level: O1

void test_write_format_tar(void)

{
  undefined1 auVar1 [16];
  int iVar2;
  mode_t mVar3;
  archive *paVar4;
  time_t tVar5;
  long lVar6;
  char *pcVar7;
  la_ssize_t lVar8;
  la_int64_t v2;
  ulong v1;
  bool bVar9;
  archive_entry *ae;
  size_t used;
  archive_entry *local_40;
  size_t local_38;
  
  v1 = 1;
  do {
    paVar4 = archive_write_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                     ,L')',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                     (void *)0x0);
    iVar2 = archive_write_set_format_ustar(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'+',0,"ARCHIVE_OK",(long)iVar2,"archive_write_set_format_ustar(a)",paVar4)
    ;
    iVar2 = archive_write_add_filter_none(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'-',0,"ARCHIVE_OK",(long)iVar2,"archive_write_add_filter_none(a)",paVar4);
    iVar2 = archive_write_set_bytes_per_block(paVar4,(int)v1);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'/',0,"ARCHIVE_OK",(long)iVar2,
                        "archive_write_set_bytes_per_block(a, (int)blocksize)",paVar4);
    iVar2 = archive_write_set_bytes_in_last_block(paVar4,(int)v1);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'1',0,"ARCHIVE_OK",(long)iVar2,
                        "archive_write_set_bytes_in_last_block(a, (int)blocksize)",paVar4);
    iVar2 = archive_write_get_bytes_in_last_block(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'3',v1,"blocksize",(long)iVar2,"archive_write_get_bytes_in_last_block(a)",
                        (void *)0x0);
    iVar2 = archive_write_open_memory(paVar4,buff,1000000,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'5',0,"ARCHIVE_OK",(long)iVar2,
                        "archive_write_open_memory(a, buff, sizeof(buff), &used)",paVar4);
    iVar2 = archive_write_get_bytes_in_last_block(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'7',v1,"blocksize",(long)iVar2,"archive_write_get_bytes_in_last_block(a)",
                        (void *)0x0);
    local_40 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                     ,L'<',(uint)(local_40 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_set_mtime(local_40,1,10);
    tVar5 = archive_entry_mtime(local_40);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'>',1,"1",tVar5,"archive_entry_mtime(ae)",(void *)0x0);
    lVar6 = archive_entry_mtime_nsec(local_40);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'?',10,"10",lVar6,"archive_entry_mtime_nsec(ae)",(void *)0x0);
    pcVar7 = strdup("file");
    archive_entry_copy_pathname(local_40,pcVar7);
    builtin_strncpy(pcVar7,"XXXX",5);
    free(pcVar7);
    pcVar7 = archive_entry_pathname(local_40);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
               ,L'D',"file","\"file\"",pcVar7,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    archive_entry_set_mode(local_40,0x81ed);
    mVar3 = archive_entry_mode(local_40);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'F',0x81ed,"S_IFREG | 0755",(ulong)mVar3,"archive_entry_mode(ae)",
                        (void *)0x0);
    archive_entry_set_size(local_40,8);
    iVar2 = archive_write_header(paVar4,local_40);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'I',0,"ARCHIVE_OK",(long)iVar2,"archive_write_header(a, ae)",paVar4);
    archive_entry_free(local_40);
    lVar8 = archive_write_data(paVar4,"12345678",9);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'K',8,"8",lVar8,"archive_write_data(a, \"12345678\", 9)",(void *)0x0);
    iVar2 = archive_write_close(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'N',0,"ARCHIVE_OK",(long)iVar2,"archive_write_close(a)",paVar4);
    iVar2 = archive_write_free(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'O',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
    failure("blocksize=%zu",v1);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = v1;
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'T',(SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7ff)) / auVar1,0) + 1) * v1,
                        "((2048 - 1)/blocksize+1)*blocksize",local_38,"used",(void *)0x0);
    paVar4 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                     ,L'Y',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar2 = archive_read_support_format_all(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'[',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_format_all(a)",paVar4
                       );
    iVar2 = archive_read_support_filter_all(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L']',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_filter_all(a)",paVar4
                       );
    iVar2 = archive_read_open_memory(paVar4,buff,local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'_',0,"ARCHIVE_OK",(long)iVar2,"archive_read_open_memory(a, buff, used)",
                        paVar4);
    iVar2 = archive_read_next_header(paVar4,&local_40);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'b',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header(a, &ae)",paVar4);
    tVar5 = archive_entry_mtime(local_40);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'd',1,"1",tVar5,"archive_entry_mtime(ae)",(void *)0x0);
    lVar6 = archive_entry_mtime_nsec(local_40);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'f',0,"0",lVar6,"archive_entry_mtime_nsec(ae)",(void *)0x0);
    tVar5 = archive_entry_atime(local_40);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'g',0,"0",tVar5,"archive_entry_atime(ae)",(void *)0x0);
    tVar5 = archive_entry_ctime(local_40);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'h',0,"0",tVar5,"archive_entry_ctime(ae)",(void *)0x0);
    pcVar7 = archive_entry_pathname(local_40);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
               ,L'i',"file","\"file\"",pcVar7,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    mVar3 = archive_entry_filetype(local_40);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'j',0x8000,"AE_IFREG",(ulong)mVar3,"archive_entry_filetype(ae)",
                        (void *)0x0);
    mVar3 = archive_entry_mode(local_40);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'k',0x81ed,"AE_IFREG | 0755",(ulong)mVar3,"archive_entry_mode(ae)",
                        (void *)0x0);
    v2 = archive_entry_size(local_40);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'l',8,"8",v2,"archive_entry_size(ae)",(void *)0x0);
    lVar8 = archive_read_data(paVar4,buff2,10);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'm',8,"8",lVar8,"archive_read_data(a, buff2, 10)",(void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'n',buff2,"buff2","12345678","\"12345678\"",8,"8",(void *)0x0);
    iVar2 = archive_read_next_header(paVar4,&local_40);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L'r',1,"ARCHIVE_EOF",(long)iVar2,"archive_read_next_header(a, &ae)",paVar4)
    ;
    iVar2 = archive_read_close(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L's',0,"ARCHIVE_OK",(long)iVar2,"archive_read_close(a)",paVar4);
    iVar2 = archive_read_free(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar.c"
                        ,L't',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
    bVar9 = v1 < 49999;
    v1 = v1 * 2 + 3;
  } while (bVar9);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_tar)
{
	struct archive_entry *ae;
	struct archive *a;
	char *p;
	size_t used;
	size_t blocksize;

	/* Repeat the following for a variety of odd blocksizes. */
	for (blocksize = 1; blocksize < 100000; blocksize += blocksize + 3) {
		/* Create a new archive in memory. */
		assert((a = archive_write_new()) != NULL);
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_set_format_ustar(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_add_filter_none(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_set_bytes_per_block(a, (int)blocksize));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_set_bytes_in_last_block(a, (int)blocksize));
		assertEqualInt(blocksize,
		    archive_write_get_bytes_in_last_block(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_open_memory(a, buff, sizeof(buff), &used));
		assertEqualInt(blocksize,
		    archive_write_get_bytes_in_last_block(a));

		/*
		 * Write a file to it.
		 */
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_set_mtime(ae, 1, 10);
		assertEqualInt(1, archive_entry_mtime(ae));
		assertEqualInt(10, archive_entry_mtime_nsec(ae));
		p = strdup("file");
		archive_entry_copy_pathname(ae, p);
		strcpy(p, "XXXX");
		free(p);
		assertEqualString("file", archive_entry_pathname(ae));
		archive_entry_set_mode(ae, S_IFREG | 0755);
		assertEqualInt(S_IFREG | 0755, archive_entry_mode(ae));
		archive_entry_set_size(ae, 8);

		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		archive_entry_free(ae);
		assertEqualInt(8, archive_write_data(a, "12345678", 9));

		/* Close out the archive. */
		assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
		assertEqualInt(ARCHIVE_OK, archive_write_free(a));

		/* This calculation gives "the smallest multiple of
		 * the block size that is at least 2048 bytes". */
		failure("blocksize=%zu", blocksize);
		assertEqualInt(((2048 - 1)/blocksize+1)*blocksize, used);

		/*
		 * Now, read the data back.
		 */
		assert((a = archive_read_new()) != NULL);
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_support_format_all(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_support_filter_all(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_open_memory(a, buff, used));

		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_next_header(a, &ae));

		assertEqualInt(1, archive_entry_mtime(ae));
		/* Not the same as above: ustar doesn't store hi-res times. */
		assertEqualInt(0, archive_entry_mtime_nsec(ae));
		assertEqualInt(0, archive_entry_atime(ae));
		assertEqualInt(0, archive_entry_ctime(ae));
		assertEqualString("file", archive_entry_pathname(ae));
		assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
		assertEqualInt(AE_IFREG | 0755, archive_entry_mode(ae));
		assertEqualInt(8, archive_entry_size(ae));
		assertEqualInt(8, archive_read_data(a, buff2, 10));
		assertEqualMem(buff2, "12345678", 8);

		/* Verify the end of the archive. */
		assertEqualIntA(a, ARCHIVE_EOF,
		    archive_read_next_header(a, &ae));
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
		assertEqualInt(ARCHIVE_OK, archive_read_free(a));
	}
}